

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QModelIndex,QPersistentModelIndex>>::
emplace<QModelIndex_const&,QModelIndex&>
          (QMovableArrayOps<std::pair<QModelIndex,_QPersistentModelIndex>_> *this,qsizetype i,
          QModelIndex *args,QModelIndex *args_1)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  pair<QModelIndex,_QPersistentModelIndex> *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  pair<QModelIndex,_QPersistentModelIndex> tmp;
  pair<QModelIndex,_QPersistentModelIndex> *in_stack_ffffffffffffff58;
  Inserter *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  undefined1 uVar4;
  GrowthPosition in_stack_ffffffffffffff7c;
  QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *in_stack_ffffffffffffff80;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::needsDetach
                    ((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)
                     in_stack_ffffffffffffff60);
  if (!bVar2) {
    if ((in_RSI == in_RDI->displaceTo) &&
       (qVar3 = QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::freeSpaceAtEnd
                          ((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)
                           CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68)),
       qVar3 != 0)) {
      QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::end
                ((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)
                 in_stack_ffffffffffffff60);
      std::pair<QModelIndex,_QPersistentModelIndex>::pair<QModelIndex_&,_true>
                ((pair<QModelIndex,_QPersistentModelIndex> *)in_stack_ffffffffffffff60,
                 &in_stack_ffffffffffffff58->first,(QModelIndex *)0x8ab3ac);
      in_RDI->displaceTo =
           (pair<QModelIndex,_QPersistentModelIndex> *)((long)&(in_RDI->displaceTo->first).r + 1);
      goto LAB_008ab584;
    }
    if ((in_RSI == (pair<QModelIndex,_QPersistentModelIndex> *)0x0) &&
       (qVar3 = QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::freeSpaceAtBegin
                          ((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)
                           CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68)),
       qVar3 != 0)) {
      QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::begin
                ((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)0x8ab3e4);
      std::pair<QModelIndex,_QPersistentModelIndex>::pair<QModelIndex_&,_true>
                ((pair<QModelIndex,_QPersistentModelIndex> *)in_stack_ffffffffffffff60,
                 &in_stack_ffffffffffffff58->first,(QModelIndex *)0x8ab3fa);
      in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
      in_RDI->displaceTo =
           (pair<QModelIndex,_QPersistentModelIndex> *)((long)&(in_RDI->displaceTo->first).r + 1);
      goto LAB_008ab584;
    }
  }
  std::pair<QModelIndex,_QPersistentModelIndex>::pair<QModelIndex_&,_true>
            ((pair<QModelIndex,_QPersistentModelIndex> *)in_stack_ffffffffffffff60,
             &in_stack_ffffffffffffff58->first,(QModelIndex *)0x8ab471);
  bVar2 = in_RDI->displaceTo != (pair<QModelIndex,_QPersistentModelIndex> *)0x0;
  uVar4 = bVar2 && in_RSI == (pair<QModelIndex,_QPersistentModelIndex> *)0x0;
  QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::detachAndGrow
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,(qsizetype)in_RDI,
             (pair<QModelIndex,_QPersistentModelIndex> **)CONCAT17(uVar4,in_stack_ffffffffffffff68),
             (QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)
             in_stack_ffffffffffffff60);
  if (bVar2 && in_RSI == (pair<QModelIndex,_QPersistentModelIndex> *)0x0) {
    QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::begin
              ((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)0x8ab4d4);
    std::pair<QModelIndex,_QPersistentModelIndex>::pair
              ((pair<QModelIndex,_QPersistentModelIndex> *)in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58);
    in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
    in_RDI->displaceTo =
         (pair<QModelIndex,_QPersistentModelIndex> *)((long)&(in_RDI->displaceTo->first).r + 1);
  }
  else {
    QMovableArrayOps<std::pair<QModelIndex,_QPersistentModelIndex>_>::Inserter::Inserter
              (in_RDI,(QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)
                      CONCAT17(uVar4,in_stack_ffffffffffffff68),(qsizetype)in_stack_ffffffffffffff60
               ,(qsizetype)in_stack_ffffffffffffff58);
    QMovableArrayOps<std::pair<QModelIndex,_QPersistentModelIndex>_>::Inserter::insertOne
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    QMovableArrayOps<std::pair<QModelIndex,_QPersistentModelIndex>_>::Inserter::~Inserter(in_RDI);
  }
  std::pair<QModelIndex,_QPersistentModelIndex>::~pair
            ((pair<QModelIndex,_QPersistentModelIndex> *)0x8ab584);
LAB_008ab584:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }